

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  If_Cut_t *pCut;
  byte bVar1;
  If_Obj_t *pIVar2;
  Vec_Mem_t *pVVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Abc_Obj_t *pObj;
  If_Par_t *pIVar9;
  Abc_Obj_t *pAVar10;
  word *pwVar11;
  DdNode *n;
  uint *puTruth;
  char *pcVar12;
  Hop_Obj_t *pHVar13;
  word *pwVar14;
  long lVar15;
  Vec_Ptr_t *pVVar16;
  ulong uVar17;
  uint iVar;
  DdManager *dd;
  Hop_Man_t *pHVar18;
  
  if ((Abc_Obj_t *)(pIfObj->field_22).pCopy != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pIfObj->field_22).pCopy;
  }
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("pIfObj->Type == IF_AND",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                  ,0x1be,
                  "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)")
    ;
  }
  pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pCut = &pIfObj->CutBest;
  pIVar9 = pIfMan->pPars;
  if ((((pIVar9->fDelayOpt == 0) && (pIVar9->fDelayOptLut == 0)) && (pIVar9->fDsdBalance == 0)) &&
     (((pIVar9->fUseTtPerm == 0 && (pIVar9->pLutStruct == (char *)0x0)) &&
      ((pIVar9->fUserRecLib == 0 && (pIVar9->nGateSize == 0)))))) {
    If_CutRotatePins(pIfMan,pCut);
    pIVar9 = pIfMan->pPars;
  }
  if ((pIVar9->fUseCnfs == 0) && (pIVar9->fUseMv == 0)) {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      uVar17 = 0;
      do {
        iVar6 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
        if (((long)iVar6 < 0) || (pIfMan->vObjs->nSize <= iVar6)) goto LAB_00264c3d;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar6];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar10 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pObj,pAVar10);
        uVar17 = uVar17 + 1;
      } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    }
  }
  else {
    uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
    if (0xffffff < uVar8) {
      uVar17 = (ulong)(uVar8 >> 0x18);
      do {
        iVar6 = *(int *)(&(pIfObj->CutBest).field_0x1c + uVar17 * 4);
        if (((long)iVar6 < 0) || (pIfMan->vObjs->nSize <= iVar6)) goto LAB_00264c3d;
        pIVar2 = (If_Obj_t *)pIfMan->vObjs->pArray[iVar6];
        if (pIVar2 == (If_Obj_t *)0x0) break;
        pAVar10 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIVar2,vCover);
        Abc_ObjAddFanin(pObj,pAVar10);
        bVar5 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar5);
    }
  }
  iVar6 = Abc_ObjLevelNew(pObj);
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar6 << 0xc;
  pIVar9 = pIfMan->pPars;
  if (pIVar9->fTruth == 0) {
    if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
      __assert_fail("pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                    ,0x27c,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
    }
    pHVar18 = (Hop_Man_t *)pNtkNew->pManFunc;
    uVar17 = 0;
    do {
      iVar6 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
      if (((long)iVar6 < 0) || (pIfMan->vObjs->nSize <= iVar6)) goto LAB_00264c3d;
      pvVar4 = pIfMan->vObjs->pArray[iVar6];
      if (pvVar4 == (void *)0x0) break;
      pHVar13 = Hop_IthVar(pHVar18,(int)uVar17);
      *(Hop_Obj_t **)((long)pvVar4 + 0x50) = pHVar13;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
    pVVar16 = pIfMan->vTemp;
    pVVar16->nSize = 0;
    pHVar13 = Abc_NodeIfToHop2_rec(pHVar18,pIfMan,pIfObj,pVVar16);
    if (pHVar13 == (Hop_Obj_t *)0x1) {
      puts("Abc_NodeIfToHop(): Computing local AIG has failed.");
      pHVar13 = (Hop_Obj_t *)0x0;
    }
    else {
      if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
        uVar17 = 0;
        do {
          iVar6 = *(int *)(&pIfObj[1].field_0x0 + uVar17 * 4);
          if (((long)iVar6 < 0) || (pIfMan->vObjs->nSize <= iVar6)) {
LAB_00264c3d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = pIfMan->vObjs->pArray[iVar6];
          if (pvVar4 == (void *)0x0) break;
          *(undefined8 *)((long)pvVar4 + 0x50) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (byte)(pIfObj->CutBest).field_0x1f);
      }
      pVVar16 = pIfMan->vTemp;
      if (0 < pVVar16->nSize) {
        lVar15 = 0;
        do {
          *(undefined8 *)pVVar16->pArray[lVar15] = 0;
          lVar15 = lVar15 + 1;
          pVVar16 = pIfMan->vTemp;
        } while (lVar15 < pVVar16->nSize);
      }
    }
    (pObj->field_5).pData = pHVar13;
    goto LAB_00264a85;
  }
  if (pIVar9->fUseBdds == 0) {
    if ((pIVar9->fUseCnfs != 0) || (pIVar9->fUseMv != 0)) {
      uVar8 = (pIfObj->CutBest).iCutFunc;
      if ((int)uVar8 < 0) goto LAB_00264c7b;
      dd = (DdManager *)pNtkNew->pManFunc;
      pwVar14 = pIfMan->puTempW;
      bVar1 = (pIfObj->CutBest).field_0x1f;
      pVVar3 = pIfMan->vTtMem[bVar1];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar11 = (word *)0x0;
      }
      else {
        uVar7 = uVar8 >> 1;
        if (pVVar3->nEntries <= (int)uVar7) goto LAB_00264cb9;
        pwVar11 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar7 = pIfMan->nTruth6Words[bVar1];
      if ((uVar8 & 1) == 0) {
        if (0 < (int)uVar7) {
          uVar17 = 0;
          do {
            pwVar14[uVar17] = pwVar11[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
      }
      else if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar14[uVar17] = ~pwVar11[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
      bVar1 = (pIfObj->CutBest).field_0x1f;
      iVar6 = 1;
      goto LAB_00264a56;
    }
    if ((pIVar9->fUseSops == 0) && (pIVar9->nGateSize < 1)) {
      if (pIVar9->fDelayOpt == 0) {
        if (pIVar9->fDsdBalance != 0) {
          pHVar18 = (Hop_Man_t *)pNtkNew->pManFunc;
          iVar6 = 1;
          goto LAB_00264b8b;
        }
        if (pIVar9->fUserRecLib == 0) {
          pwVar14 = If_CutTruthW(pIfMan,pCut);
          uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
          if (0xffffff < uVar8 && pIfMan->pPars->fUseTtPerm != 0) {
            uVar7 = uVar8 >> 0x18;
            iVar = 0;
            do {
              if (((uint)(pIfObj->CutBest).uMaskFunc >> (iVar & 0x1f) & 1) != 0) {
                iVar6 = 1 << ((char)uVar7 - 6U & 0x1f);
                if (uVar8 < 0x7000000) {
                  iVar6 = 1;
                }
                Abc_TtFlip(pwVar14,iVar6,iVar);
                uVar8 = *(uint *)&(pIfObj->CutBest).field_0x1c;
              }
              iVar = iVar + 1;
              uVar7 = uVar8 >> 0x18;
            } while (iVar < uVar7);
          }
          pHVar13 = Kit_TruthToHop((Hop_Man_t *)pNtkNew->pManFunc,(uint *)pwVar14,uVar8 >> 0x18,
                                   vCover);
        }
        else {
          pHVar13 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
        }
      }
      else {
        pHVar18 = (Hop_Man_t *)pNtkNew->pManFunc;
        iVar6 = 0;
LAB_00264b8b:
        pHVar13 = Abc_NodeBuildFromMini(pHVar18,pIfMan,pCut,iVar6);
      }
      (pObj->field_5).pData = pHVar13;
    }
    else {
      puTruth = If_CutTruth(pIfMan,pCut);
      uVar8 = Kit_TruthIsop(puTruth,(uint)(byte)(pIfObj->CutBest).field_0x1f,vCover,1);
      if (1 < uVar8) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                      ,0x1e8,
                      "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((vCover->nSize == 0) || ((vCover->nSize == 1 && (*vCover->pArray == 0)))) {
        if (uVar8 != 0) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                        ,0x1ec,
                        "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                       );
        }
        pcVar12 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,
                                   (uint)(byte)(pIfObj->CutBest).field_0x1f,(int *)0x0);
        (pObj->field_5).pData = pcVar12;
        if (vCover->nSize == 0) {
          pObj = Abc_NtkCreateNodeConst0(pNtkNew);
        }
        else {
          pObj = Abc_NtkCreateNodeConst1(pNtkNew);
        }
      }
      else {
        pcVar12 = Abc_SopCreateFromIsop
                            ((Mem_Flex_t *)pNtkNew->pManFunc,
                             (uint)(byte)(pIfObj->CutBest).field_0x1f,vCover);
        (pObj->field_5).pData = pcVar12;
        if (uVar8 != 0) {
          Abc_SopComplement(pcVar12);
        }
      }
    }
  }
  else {
    uVar8 = (pIfObj->CutBest).iCutFunc;
    if ((int)uVar8 < 0) {
LAB_00264c7b:
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                    ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
    }
    dd = (DdManager *)pNtkNew->pManFunc;
    pwVar14 = pIfMan->puTempW;
    bVar1 = (pIfObj->CutBest).field_0x1f;
    pVVar3 = pIfMan->vTtMem[bVar1];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar11 = (word *)0x0;
    }
    else {
      uVar7 = uVar8 >> 1;
      if (pVVar3->nEntries <= (int)uVar7) {
LAB_00264cb9:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar11 = pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                (ulong)(uVar7 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar7 = pIfMan->nTruth6Words[bVar1];
    if ((uVar8 & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar17 = 0;
        do {
          pwVar14[uVar17] = pwVar11[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
    }
    else if (0 < (int)uVar7) {
      uVar17 = 0;
      do {
        pwVar14[uVar17] = ~pwVar11[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar7 != uVar17);
    }
    bVar1 = (pIfObj->CutBest).field_0x1f;
    iVar6 = 0;
LAB_00264a56:
    n = Kit_TruthToBdd(dd,(uint *)pwVar14,(uint)bVar1,iVar6);
    (pObj->field_5).pData = n;
    Cudd_Ref(n);
  }
  if (((((pIfObj->CutBest).field_0x1d & 0x10) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
     (pIfMan->pPars->fDsdBalance == 0)) {
    Abc_NodeComplement(pObj);
  }
LAB_00264a85:
  (pIfObj->field_22).pCopy = pObj;
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    pCutBest = If_ObjCutBest( pIfObj );
//    printf( "%d 0x%02X %d\n", pCutBest->nLeaves, 0xff & *If_CutTruth(pCutBest), pIfMan->pPars->pFuncCost(pCutBest) );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}